

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void divide_subset_split<double>
               (size_t *ix_arr,double *x,size_t st,size_t end,double split_point,
               MissingAction missing_action,size_t *st_NA,size_t *end_NA,size_t *split_ix)

{
  undefined8 uVar1;
  uint uVar2;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  ulong *in_R9;
  double in_XMM0_Qa;
  size_t row_2;
  size_t row_1;
  size_t row;
  size_t temp;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_18;
  
  local_50 = in_RDX;
  local_48 = in_RDX;
  local_18 = in_RDX;
  if (in_R8D == 0) {
    for (; local_48 <= in_RCX; local_48 = local_48 + 1) {
      if (*(double *)(in_RSI + *(long *)(in_RDI + local_48 * 8) * 8) <= in_XMM0_Qa) {
        uVar1 = *(undefined8 *)(in_RDI + local_18 * 8);
        *(undefined8 *)(in_RDI + local_18 * 8) = *(undefined8 *)(in_RDI + local_48 * 8);
        *(undefined8 *)(in_RDI + local_48 * 8) = uVar1;
        local_18 = local_18 + 1;
      }
    }
    *(ulong *)row = local_18;
  }
  else {
    for (; local_50 <= in_RCX; local_50 = local_50 + 1) {
      uVar2 = std::isnan(*(double *)(in_RSI + *(long *)(in_RDI + local_50 * 8) * 8));
      if (((uVar2 & 1) == 0) &&
         (*(double *)(in_RSI + *(long *)(in_RDI + local_50 * 8) * 8) <= in_XMM0_Qa)) {
        uVar1 = *(undefined8 *)(in_RDI + local_18 * 8);
        *(undefined8 *)(in_RDI + local_18 * 8) = *(undefined8 *)(in_RDI + local_50 * 8);
        *(undefined8 *)(in_RDI + local_50 * 8) = uVar1;
        local_18 = local_18 + 1;
      }
    }
    *in_R9 = local_18;
    for (local_58 = local_18; local_58 <= in_RCX; local_58 = local_58 + 1) {
      uVar2 = std::isnan(*(double *)(in_RSI + *(long *)(in_RDI + local_58 * 8) * 8));
      if ((uVar2 & 1) != 0) {
        uVar1 = *(undefined8 *)(in_RDI + local_18 * 8);
        *(undefined8 *)(in_RDI + local_18 * 8) = *(undefined8 *)(in_RDI + local_58 * 8);
        *(undefined8 *)(in_RDI + local_58 * 8) = uVar1;
        local_18 = local_18 + 1;
      }
    }
    *(ulong *)row_1 = local_18;
  }
  return;
}

Assistant:

void divide_subset_split(size_t *restrict ix_arr, real_t x[], size_t st, size_t end, double split_point,
                         MissingAction missing_action, size_t &restrict st_NA, size_t &restrict end_NA, size_t &restrict split_ix) noexcept
{
    size_t temp;

    /* if NAs are not to be bothered with, just need to do a single pass */
    if (missing_action == Fail)
    {
        /* move to the left if it's l.e. split point */
        for (size_t row = st; row <= end; row++)
        {
            if (x[ix_arr[row]] <= split_point)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        split_ix = st;
    }

    /* otherwise, first put to the left all l.e. and not NA, then all NAs to the end of the left */
    else
    {
        for (size_t row = st; row <= end; row++)
        {
            if (!std::isnan(x[ix_arr[row]]) && x[ix_arr[row]] <= split_point)
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        st_NA = st;

        for (size_t row = st; row <= end; row++)
        {
            if (unlikely(std::isnan(x[ix_arr[row]])))
            {
                temp        = ix_arr[st];
                ix_arr[st]  = ix_arr[row];
                ix_arr[row] = temp;
                st++;
            }
        }
        end_NA = st;
    }
}